

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnhancedMode1Code.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::EnhancedMode1Code::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EnhancedMode1Code *this)

{
  ostream *poVar1;
  ulong uVar2;
  char cVar3;
  KString local_380;
  string local_360 [32];
  KStringStream ss;
  ostream local_330 [376];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_330,"Enhanced Mode 1 Code: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->super_ModeXCodeRecord).m_CodeUnion.m_ui16Code >> 9 & 7);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->super_ModeXCodeRecord).m_CodeUnion.m_ui16Code >> 6 & 7);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->super_ModeXCodeRecord).m_CodeUnion.m_ui16Code >> 3 & 7);
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->super_ModeXCodeRecord).m_CodeUnion.m_ui16Code & 7)
  ;
  poVar1 = std::operator<<(poVar1,"\n");
  ModeXCodeRecord::GetAsString_abi_cxx11_(&local_380,&this->super_ModeXCodeRecord);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,'\t');
  uVar2 = 0;
  while( true ) {
    uVar2 = uVar2 & 0xffff;
    if (local_380._M_string_length <= uVar2) break;
    cVar3 = local_380._M_dataplus._M_p[uVar2];
    if (local_380._M_string_length - 1 != uVar2 && cVar3 == '\n') {
      cVar3 = '\t';
      std::operator<<(local_1a8,'\n');
    }
    std::operator<<(local_1a8,cVar3);
    uVar2 = (ulong)((int)uVar2 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::operator<<(poVar1,local_360);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString EnhancedMode1Code::GetAsString() const
{
    KStringStream ss;

    ss << "Enhanced Mode 1 Code: " << m_CodeUnion.m_ui16Bits9_11
		                           << m_CodeUnion.m_ui16Bits6_8 
								   << m_CodeUnion.m_ui16Bits3_5 
								   << m_CodeUnion.m_ui16Bits0_2 
								   << "\n"
	   << IndentString( ModeXCodeRecord::GetAsString(), 1 );
 
    return ss.str();
}